

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,ByteData *signature,SigHashType *sighash_type)

{
  pointer *this;
  uint32_t uVar1;
  uint32_t uVar2;
  size_type sVar3;
  size_type sVar4;
  uchar *sig_00;
  uchar *bytes_out;
  CfdException *this_00;
  reference pvVar5;
  uint32_t local_144;
  CfdSourceLocation local_140;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  CfdSourceLocation local_100;
  int local_e8 [2];
  int ret;
  CfdException *except;
  undefined1 local_98 [7];
  uint8_t flag;
  undefined1 local_7c [8];
  SigHashType temp_sighash;
  size_t written;
  allocator<unsigned_char> local_51;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  SigHashType *sighash_type_local;
  ByteData *signature_local;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,signature);
  ::std::allocator<unsigned_char>::allocator(&local_51);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0x49,&local_51);
  ::std::allocator<unsigned_char>::~allocator(&local_51);
  temp_sighash.hash_algorithm_ = kSigHashDefault;
  temp_sighash.is_anyone_can_pay_ = false;
  temp_sighash.is_fork_id_ = false;
  temp_sighash._10_2_ = 0;
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar3 - 2 <= sVar4) {
    SigHashType::SigHashType((SigHashType *)local_7c);
    ConvertSignatureFromDer((ByteData *)local_98,signature,(SigHashType *)local_7c);
    ByteData::~ByteData((ByteData *)local_98);
    uVar1 = SigHashType::GetSigHashFlag(sighash_type);
    except._7_1_ = (undefined1)uVar1;
    uVar2 = SigHashType::GetSigHashFlag((SigHashType *)local_7c);
    if ((uVar1 & 0xff) == uVar2) {
      ByteData::ByteData(__return_storage_ptr__,signature);
      goto LAB_00510e2a;
    }
  }
  this = &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  sig_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  local_e8[0] = wally_ec_sig_to_der(sig_00,sVar3,bytes_out,sVar4,
                                    (size_t *)&temp_sighash.hash_algorithm_);
  if (local_e8[0] != 0) {
    local_100.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_100.filename = local_100.filename + 1;
    local_100.line = 0x32e;
    local_100.funcname = "ConvertSignatureToDer";
    logger::warn<int&>(&local_100,"wally_ec_sig_to_der NG[{}].",local_e8);
    local_122 = 1;
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_120,"der encode error.",&local_121);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_120);
    local_122 = 0;
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((ulong)temp_sighash._4_8_ < 0x49) {
    local_140.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_140.filename = local_140.filename + 1;
    local_140.line = 0x335;
    local_140.funcname = "ConvertSignatureToDer";
    local_144 = SigHashType::GetSigHashFlag(sighash_type);
    logger::info<unsigned_long&,unsigned_int>
              (&local_140,"size[{}]. append[{}]",(unsigned_long *)&temp_sighash.hash_algorithm_,
               &local_144);
    uVar1 = SigHashType::GetSigHashFlag(sighash_type);
    pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
                        temp_sighash._4_8_);
    *pvVar5 = (value_type)uVar1;
    temp_sighash._4_8_ = temp_sighash._4_8_ + 1;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,temp_sighash._4_8_);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
LAB_00510e2a:
  except._0_4_ = 1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const ByteData &signature, const SigHashType &sighash_type) {
  std::vector<uint8_t> sig = signature.GetBytes();
  // Secure the size considering SigHashType(1byte).
  std::vector<uint8_t> output(EC_SIGNATURE_DER_MAX_LEN + 1);
  size_t written = 0;

  if ((output.size() - 2) <= sig.size()) {
    try {
      SigHashType temp_sighash;
      ConvertSignatureFromDer(signature, &temp_sighash);
      uint8_t flag = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
      if (flag == temp_sighash.GetSigHashFlag()) {
        return signature;
      }
    } catch (const CfdException &except) {
      info(
          CFD_LOG_SOURCE, "ConvertSignatureFromDer fail. fall through. ({})",
          std::string(except.what()));
    }
  }

  // Convert a compact signature to DER encoding.
  int ret = wally_ec_sig_to_der(
      sig.data(), sig.size(), output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_sig_to_der NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "der encode error.");
  }

  if (written <= EC_SIGNATURE_DER_MAX_LEN) {
    // add SigHashType
    info(
        CFD_LOG_SOURCE, "size[{}]. append[{}]", written,
        sighash_type.GetSigHashFlag());
    output[written] = static_cast<uint8_t>(sighash_type.GetSigHashFlag());
    ++written;
  }
  output.resize(written);

  return ByteData(output);
}